

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O3

bool __thiscall ON_RevSurface::Reverse(ON_RevSurface *this,int dir)

{
  ON_Interval *this_00;
  double dVar1;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  
  uVar2 = (uint)(dir == 0);
  if (this->m_bTransposed == false) {
    uVar2 = dir;
  }
  if (uVar2 == 1) {
    if (this->m_curve != (ON_Curve *)0x0) {
      iVar3 = (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])();
      return SUB41(iVar3,0);
    }
  }
  else if (uVar2 == 0) {
    ON_Line::Reverse(&this->m_axis);
    this_00 = &this->m_angle;
    pdVar4 = ON_Interval::operator[](this_00,0);
    dVar1 = *pdVar4;
    pdVar4 = ON_Interval::operator[](this_00,1);
    ON_Interval::Set(this_00,6.283185307179586 - *pdVar4,6.283185307179586 - dVar1);
    ON_Interval::Reverse(&this->m_t);
    return true;
  }
  return false;
}

Assistant:

bool ON_RevSurface::Reverse( int dir )
{
  bool rc = false;
  if ( m_bTransposed )
    dir = dir ? 0 : 1;
  if ( dir == 0 )
  {
    m_axis.Reverse();
    double a0 = m_angle[0];
    double a1 = m_angle[1];
    m_angle.Set( 2.0*ON_PI - a1, 2.0*ON_PI - a0 );
    m_t.Reverse();
    rc = true;
  }
  else if ( dir == 1 && m_curve )
  {
    rc = m_curve->Reverse();
  }
  return rc;
}